

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCallSimplifierVisitor.cpp
# Opt level: O1

void __thiscall
IRT::CCallSimplifierVisitor::Visit(CCallSimplifierVisitor *this,CLabelStatement *statement)

{
  CStatement *pCVar1;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> _Var2;
  CStatement *in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  (*(statement->super_CStatement).super_IStatement.super_INode._vptr_INode[3])(&local_18);
  _Var2._M_head_impl = local_18._M_head_impl;
  local_18._M_head_impl = (CStatement *)0x0;
  pCVar1 = (this->childStatement)._M_t.
           super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
           .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
  (this->childStatement)._M_t.
  super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
  super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (pCVar1 != (CStatement *)0x0) {
    (**(code **)((long)(pCVar1->super_IStatement).super_INode + 0x10))();
  }
  if (local_18._M_head_impl != (CStatement *)0x0) {
    (*((local_18._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
  }
  return;
}

Assistant:

void IRT::CCallSimplifierVisitor::Visit(const CLabelStatement &statement) {
    childStatement = std::move(statement.Copy());
}